

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O3

BasicValue *
cvm::Ncurses::MoveAddChar
          (BasicValue *__return_storage_ptr__,
          list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *Args)

{
  undefined4 uVar1;
  _List_node_base *p_Var2;
  int iVar3;
  int iVar4;
  
  if ((Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl._M_node.
      _M_size == 3) {
    p_Var2 = (Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl.
             _M_node.super__List_node_base._M_next;
    iVar3 = BasicValue::toInt((BasicValue *)(p_Var2 + 1));
    iVar4 = BasicValue::toInt((BasicValue *)(p_Var2->_M_next + 1));
    uVar1 = *(undefined4 *)
             &(Args->super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>)._M_impl.
              _M_node.super__List_node_base._M_prev[3]._M_prev;
    iVar3 = wmove(_stdscr,iVar3,iVar4);
    if (iVar3 == -1) {
      iVar3 = -1;
    }
    else {
      iVar3 = waddch(_stdscr,(int)(char)uVar1);
    }
    __return_storage_ptr__->Type = IntType;
    (__return_storage_ptr__->StrVal)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->StrVal).field_2;
    (__return_storage_ptr__->StrVal)._M_string_length = 0;
    (__return_storage_ptr__->StrVal).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->field_2).IntVal = iVar3;
  }
  else {
    __return_storage_ptr__->Type = VoidType;
    (__return_storage_ptr__->StrVal)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->StrVal).field_2;
    (__return_storage_ptr__->StrVal)._M_string_length = 0;
    (__return_storage_ptr__->StrVal).field_2._M_local_buf[0] = '\0';
  }
  (__return_storage_ptr__->ArrayPtr).
  super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->ArrayPtr).
  super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return __return_storage_ptr__;
}

Assistant:

BasicValue Ncurses::MoveAddChar(std::list<BasicValue> &Args) {
  if (Args.size() != 3)
    return BasicValue();

  auto Iterator = Args.cbegin();

  int Y = Iterator->toInt();
  ++Iterator;
  int X = Iterator->toInt();

  char C = static_cast<char>(Args.back().IntVal);
  return mvaddch(Y, X, C);
}